

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

EdgePolyline * __thiscall
S2Builder::Graph::PolylineBuilder::BuildWalk
          (EdgePolyline *__return_storage_ptr__,PolylineBuilder *this,VertexId v)

{
  ulong *puVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  iterator __position;
  _Bit_type *p_Var5;
  long lVar6;
  mapped_type *pmVar7;
  int *piVar8;
  byte bVar9;
  EdgeId e;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int local_48;
  int local_44;
  vector<int,std::allocator<int>> *local_40;
  btree_map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = (long)v;
  piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar10 = piVar3[lVar6];
  iVar14 = piVar3[lVar6 + 1];
  local_40 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  if (iVar10 != iVar14) {
    local_38 = &this->excess_used_;
    piVar8 = piVar3 + lVar6;
    piVar3 = piVar3 + lVar6;
    local_44 = v;
    do {
      local_48 = -1;
      uVar11 = (ulong)iVar10;
      iVar10 = 0x7fffffff;
      uVar12 = 0xffffffff;
      do {
        iVar2 = (int)uVar11;
        iVar13 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar13 = iVar2;
        }
        if ((((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
              [(long)(iVar13 >> 6) +
               (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
              (uVar11 & 0x3f) & 1) == 0) &&
           (iVar13 = (this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11], iVar13 < iVar10)) {
          uVar12 = uVar11 & 0xffffffff;
          iVar10 = iVar13;
          local_48 = iVar2;
        }
        uVar11 = uVar11 + 1;
      } while (iVar14 != (int)uVar11);
      if ((int)uVar12 < 0) {
        return (EdgePolyline *)local_40;
      }
      if (this->directed_ == true) {
        piVar4 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = (piVar3[1] + piVar4[lVar6]) - (*piVar8 + piVar4[lVar6 + 1]);
      }
      else {
        iVar14 = (piVar3[1] - *piVar8) % 2;
      }
      pmVar7 = gtl::internal_btree::
               btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
               ::operator[](&local_38->
                             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>_>
                            ,&local_44);
      bVar9 = this->directed_;
      if ((bool)bVar9 == true) {
        if (iVar14 - *pmVar7 < 0) {
LAB_001c2296:
          piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_start;
          iVar14 = piVar3[local_44];
          iVar2 = piVar3[(long)local_44 + 1];
          if (iVar14 != iVar2) {
            lVar6 = (long)iVar14 << 2;
            do {
              iVar14 = *(int *)((long)(this->in_).in_edge_ids_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar6);
              uVar11 = (ulong)iVar14;
              iVar13 = iVar14 + 0x3f;
              if (-1 < (long)uVar11) {
                iVar13 = iVar14;
              }
              if ((((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [(long)(iVar13 >> 6) +
                     (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                     0xffffffffffffffff] >> (uVar11 & 0x3f) & 1) == 0) &&
                 ((this->min_input_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] <= iVar10)) {
                return (EdgePolyline *)local_40;
              }
              lVar6 = lVar6 + 4;
            } while ((long)iVar2 * 4 != lVar6);
          }
        }
      }
      else if ((iVar14 - *pmVar7 & 0x80000001U) == 1) goto LAB_001c2296;
      __position._M_current = *(int **)(local_40 + 8);
      if (__position._M_current == *(int **)(local_40 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_40,__position,&local_48);
        bVar9 = this->directed_;
      }
      else {
        *__position._M_current = local_48;
        *(int **)(local_40 + 8) = __position._M_current + 1;
      }
      uVar11 = (ulong)local_48;
      p_Var5 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      iVar10 = local_48 + 0x3f;
      if (-1 < local_48) {
        iVar10 = local_48;
      }
      puVar1 = p_Var5 + (long)(iVar10 >> 6) +
                        (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 | 1L << ((byte)local_48 & 0x3f);
      if ((bVar9 & 1) == 0) {
        iVar10 = (this->sibling_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        iVar14 = iVar10 + 0x3f;
        if (-1 < (long)iVar10) {
          iVar14 = iVar10;
        }
        puVar1 = p_Var5 + (long)(iVar14 >> 6) +
                          (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) +
                          0xffffffffffffffff;
        *puVar1 = *puVar1 | 1L << ((byte)iVar10 & 0x3f);
      }
      this->edges_left_ = this->edges_left_ + -1;
      local_44 = (this->g_->edges_->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar11].second;
      lVar6 = (long)local_44;
      piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = piVar3 + lVar6;
      iVar10 = *piVar8;
      iVar14 = piVar8[1];
      piVar3 = piVar3 + lVar6;
    } while (iVar10 != iVar14);
  }
  return (EdgePolyline *)local_40;
}

Assistant:

Graph::EdgePolyline Graph::PolylineBuilder::BuildWalk(VertexId v) {
  EdgePolyline polyline;
  for (;;) {
    // Follow the edge with the smallest input edge id.
    EdgeId best_edge = -1;
    InputEdgeId best_out_id = std::numeric_limits<InputEdgeId>::max();
    for (EdgeId e : out_.edge_ids(v)) {
      if (used_[e] || min_input_ids_[e] >= best_out_id) continue;
      best_out_id = min_input_ids_[e];
      best_edge = e;
    }
    if (best_edge < 0) return polyline;
    // For idempotency when there are multiple input polylines, we stop the
    // walk early if "best_edge" might be a continuation of a different
    // incoming edge.
    int excess = excess_degree(v) - excess_used_[v];
    if (directed_ ? (excess < 0) : (excess % 2) == 1) {
      for (EdgeId e : in_.edge_ids(v)) {
        if (!used_[e] && min_input_ids_[e] <= best_out_id) {
          return polyline;
        }
      }
    }
    polyline.push_back(best_edge);
    used_[best_edge] = true;
    if (!directed_) used_[sibling_map_[best_edge]] = true;
    --edges_left_;
    v = g_.edge(best_edge).second;
  }
}